

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMotorRotationDriveline::Setup(ChLinkMotorRotationDriveline *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  ChLinkMate *pCVar4;
  char cVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  undefined1 auVar8 [16];
  
  cVar5 = (**(code **)(**(long **)&(this->super_ChLinkMotorRotation).field_0x278 + 0x48))();
  auVar9._8_56_ = extraout_var;
  auVar9._0_8_ = extraout_XMM1_Qa;
  auVar8 = auVar9._0_16_;
  if (cVar5 != '\0') {
    *(undefined8 *)(*(long *)&(this->super_ChLinkMotorRotation).field_0x278 + 0x68) =
         *(undefined8 *)
          &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
           super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_x;
  }
  iVar6 = (*(((this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar6 != '\0') {
    pCVar4 = &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
              super_ChLinkMate;
    uVar1 = (pCVar4->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.offset_x;
    uVar2 = (pCVar4->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.offset_w;
    auVar7._4_4_ = uVar2;
    auVar7._0_4_ = uVar1;
    peVar3 = (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar8 = vpcmpeqd_avx(auVar8,auVar8);
    auVar7._8_8_ = 0;
    auVar8 = vpsubd_avx(auVar7,auVar8);
    (peVar3->super_ChPhysicsItem).offset_x = (int)auVar8._0_8_;
    (peVar3->super_ChPhysicsItem).offset_w = (int)((ulong)auVar8._0_8_ >> 0x20);
  }
  iVar6 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (((this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super_ChPhysicsItem).offset_L =
       iVar6 + (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_L;
  (((this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super_ChPhysicsItem).offset_L =
       iVar6 + 1 +
       (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_L;
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::Setup() {
	if (innershaft1->IsActive()) {
        innershaft1->SetOffset_x(this->offset_x + 0);
        innershaft1->SetOffset_w(this->offset_w + 0);
	}
    if (innershaft2->IsActive()) {
        innershaft2->SetOffset_x(this->offset_x + 1);
        innershaft2->SetOffset_w(this->offset_w + 1);
    }
    int nc = mask.nconstr;
    innerconstraint1->SetOffset_L(this->offset_L + nc + 0);
    innerconstraint2->SetOffset_L(this->offset_L + nc + 1);
}